

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O1

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::CopyFrom
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,
          TPZMatrix<long_double> *mat)

{
  int64_t iVar1;
  TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *cp;
  
  if (mat == (TPZMatrix<long_double> *)0x0) {
    cp = (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)0x0;
  }
  else {
    cp = (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)
         __dynamic_cast(mat,&TPZMatrix<long_double>::typeinfo,
                        &TPZDohrPrecond<long_double,TPZDohrSubstruct<long_double>>::typeinfo,0);
  }
  if (cp != (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *)0x0) {
    TPZMatrix<long_double>::operator=
              (&this->super_TPZMatrix<long_double>,&cp->super_TPZMatrix<long_double>);
    if (cp != this) {
      std::__cxx11::
      list<TPZAutoPointer<TPZDohrSubstruct<long_double>>,std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>>>>
      ::_M_assign_dispatch<std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstruct<long_double>>>>
                ((list<TPZAutoPointer<TPZDohrSubstruct<long_double>>,std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>>>>
                  *)&this->fGlobal,
                 (cp->fGlobal).
                 super__List_base<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next,&cp->fGlobal);
    }
    this->fNumThreads = cp->fNumThreads;
    iVar1 = cp->fNumCoarse;
    this->fCoarse = cp->fCoarse;
    this->fNumCoarse = iVar1;
    TPZAutoPointer<TPZDohrAssembly<long_double>_>::operator=(&this->fAssemble,&cp->fAssemble);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZDohrPrecond<long double, TPZDohrSubstruct<long double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = long double, TSubStruct = TPZDohrSubstruct<long double>]"
             ,0xab);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/SubStruct/tpzdohrprecond.h"
             ,0x50);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZDohrPrecond<TVar,TSubStruct> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }